

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::GetDirFromEnv_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,
          initializer_list<const_char_*> environment_variables,char *fallback,char separator)

{
  char *__s;
  string *extraout_RAX;
  size_t sVar1;
  string *extraout_RAX_00;
  long *plVar2;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  long lVar3;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  if (environment_variables._M_array != (iterator)0x0) {
    lVar3 = 0;
    do {
      __s = getenv(*(char **)(this + lVar3));
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        sVar1 = strlen(__s);
        if (__s[sVar1 - 1] == '/') {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          sVar1 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,__s,__s + sVar1);
          return extraout_RAX_00;
        }
        local_50 = local_40;
        sVar1 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar1);
        plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,*plVar2,plVar2[1] + *plVar2);
        if (local_50 == local_40) {
          return extraout_RAX_01;
        }
        operator_delete(local_50,local_40[0] + 1);
        return extraout_RAX_02;
      }
      lVar3 = lVar3 + 8;
    } while ((long)environment_variables._M_array << 3 != lVar3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)environment_variables._M_len,
             (allocator<char> *)&local_50);
  return extraout_RAX;
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}